

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_futils.c
# Opt level: O0

SUNErrCode SUNDIALSFileOpen(char *filename,char *mode,FILE **fp_out)

{
  int iVar1;
  undefined8 *in_RDX;
  char *in_RSI;
  char *in_RDI;
  FILE *fp;
  SUNErrCode err;
  FILE *local_28;
  SUNErrCode local_1c;
  
  local_1c = 0;
  local_28 = (FILE *)*in_RDX;
  if (in_RDI != (char *)0x0) {
    iVar1 = strcmp(in_RDI,"stdout");
    if (iVar1 == 0) {
      local_28 = _stdout;
    }
    else {
      iVar1 = strcmp(in_RDI,"stderr");
      if (iVar1 == 0) {
        local_28 = _stderr;
      }
      else {
        local_28 = fopen(in_RDI,in_RSI);
      }
    }
  }
  if (local_28 == (FILE *)0x0) {
    local_1c = -0x2707;
  }
  *in_RDX = local_28;
  return local_1c;
}

Assistant:

SUNErrCode SUNDIALSFileOpen(const char* filename, const char* mode, FILE** fp_out)
{
  SUNErrCode err = SUN_SUCCESS;
  FILE* fp       = *fp_out;

  if (filename)
  {
    if (!strcmp(filename, "stdout")) { fp = stdout; }
    else if (!strcmp(filename, "stderr")) { fp = stderr; }
    else { fp = fopen(filename, mode); }
  }

  if (!fp) { err = SUN_ERR_FILE_OPEN; }

  *fp_out = fp;
  return err;
}